

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

string * __thiscall
gmlc::utilities::stringOps::getTailString_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,string_view sep)

{
  size_type sVar1;
  stringOps *psVar2;
  stringOps *psVar3;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (char *)input._M_len;
  local_20._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&local_20,(char *)sep._M_len,0xffffffffffffffff,(size_type)input._M_str);
  psVar3 = (stringOps *)local_20._M_str;
  psVar2 = (stringOps *)local_20._M_len;
  if (sVar1 != 0xffffffffffffffff) {
    psVar2 = (stringOps *)(input._M_str + sVar1);
    if (local_20._M_len < psVar2) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 psVar2);
    }
    psVar3 = psVar2 + (long)local_20._M_str;
    psVar2 = (stringOps *)(local_20._M_len + -(long)psVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,psVar3,psVar2 + (long)psVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string
        getTailString(std::string_view input, std::string_view sep) noexcept
    {
        auto sepLoc = input.rfind(sep);
        std::string_view ret = (sepLoc == std::string_view::npos) ?
            input :
            input.substr(sepLoc + sep.size());
        return std::string(ret);
    }